

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::visitExpression(EarlyCastFinder *this,Expression *curr)

{
  bool bVar1;
  size_t i;
  ulong uVar2;
  undefined1 local_178 [8];
  ShallowEffectAnalyzer currAnalyzer;
  
  ShallowEffectAnalyzer::ShallowEffectAnalyzer
            ((ShallowEffectAnalyzer *)local_178,&this->options,
             (this->
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
             ).
             super_PostWalker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
             .currModule,curr);
  bVar1 = EffectAnalyzer::invalidates(&this->testRefCast,(EffectAnalyzer *)local_178);
  if (bVar1) {
    for (uVar2 = 0; uVar2 < this->numLocals; uVar2 = uVar2 + 1) {
      flushRefCastResult(this,uVar2,
                         (this->
                         super_LinearExecutionWalker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                         ).
                         super_PostWalker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                         .currModule);
    }
  }
  bVar1 = EffectAnalyzer::invalidates(&this->testRefAs,(EffectAnalyzer *)local_178);
  if (bVar1) {
    for (uVar2 = 0; uVar2 < this->numLocals; uVar2 = uVar2 + 1) {
      flushRefAsResult(this,uVar2,
                       (this->
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                       ).
                       super_PostWalker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                       .currModule);
    }
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_178);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // A new one is instantiated for each expression to determine
    // if a cast can be moved past it.
    ShallowEffectAnalyzer currAnalyzer(options, *getModule(), curr);

    if (testRefCast.invalidates(currAnalyzer)) {
      for (size_t i = 0; i < numLocals; i++) {
        flushRefCastResult(i, *getModule());
      }
    }

    if (testRefAs.invalidates(currAnalyzer)) {
      for (size_t i = 0; i < numLocals; i++) {
        flushRefAsResult(i, *getModule());
      }
    }
  }